

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTypeHandler.cpp
# Opt level: O0

bool JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining
               (JITTypeHandler *oldTypeHandler,JITTypeHandler *newTypeHandler)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 uVar4;
  PropertyIndex PVar5;
  undefined4 *puVar6;
  bool local_21;
  bool local_19;
  JITTypeHandler *newTypeHandler_local;
  JITTypeHandler *oldTypeHandler_local;
  
  if (oldTypeHandler == (JITTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTypeHandler.cpp"
                       ,0x36,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (newTypeHandler == (JITTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTypeHandler.cpp"
                       ,0x37,"(newTypeHandler)","newTypeHandler");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = GetInlineSlotCapacity(oldTypeHandler);
  uVar4 = GetInlineSlotCapacity(newTypeHandler);
  local_19 = true;
  if (uVar3 != uVar4) {
    bVar2 = IsObjectHeaderInlinedTypeHandler(oldTypeHandler);
    local_21 = false;
    if (bVar2) {
      uVar3 = GetInlineSlotCapacity(newTypeHandler);
      uVar4 = GetInlineSlotCapacity(oldTypeHandler);
      PVar5 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      local_21 = (uint)uVar3 == (uint)uVar4 - (uint)PVar5;
    }
    local_19 = local_21;
  }
  return local_19;
}

Assistant:

bool
JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(const JITTypeHandler * oldTypeHandler, const JITTypeHandler * newTypeHandler)
{
    Assert(oldTypeHandler);
    Assert(newTypeHandler);

    return
        oldTypeHandler->GetInlineSlotCapacity() == newTypeHandler->GetInlineSlotCapacity() ||
        (
            oldTypeHandler->IsObjectHeaderInlinedTypeHandler() &&
            newTypeHandler->GetInlineSlotCapacity() ==
            oldTypeHandler->GetInlineSlotCapacity() - Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
        );
}